

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CustomModel::CustomModel
          (CustomModel *this,Arena *arena,bool is_message_owned)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__MessageLite_004be5f0;
  google::protobuf::internal::InternalMetadata::InternalMetadata
            (&(this->super_MessageLite)._internal_metadata_,arena,is_message_owned);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__CustomModel_004bda60;
  (this->parameters_).map_.elements_.num_elements_ = 0;
  (this->parameters_).map_.elements_.num_buckets_ = 1;
  (this->parameters_).map_.elements_.seed_ = 0;
  (this->parameters_).map_.elements_.index_of_first_non_null_ = 1;
  (this->parameters_).map_.elements_.table_ =
       (void **)&google::protobuf::internal::kGlobalEmptyTable;
  (this->parameters_).map_.elements_.alloc_.arena_ = arena;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  (this->classname_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->description_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  return;
}

Assistant:

CustomModel::CustomModel(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena, is_message_owned),
  parameters_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:CoreML.Specification.CustomModel)
}